

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

void mp_zero(mp_int *a)

{
  int iVar1;
  mp_digit *pmVar2;
  long lVar3;
  
  a->sign = 0;
  a->used = 0;
  pmVar2 = a->dp;
  iVar1 = a->alloc;
  for (lVar3 = 0; (int)lVar3 < iVar1; lVar3 = lVar3 + 1) {
    pmVar2[lVar3] = 0;
  }
  return;
}

Assistant:

void mp_zero (mp_int * a)
{
  int       n;
  mp_digit *tmp;

  a->sign = MP_ZPOS;
  a->used = 0;

  tmp = a->dp;
  for (n = 0; n < a->alloc; n++) {
     *tmp++ = 0;
  }
}